

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarimax_predict(sarimax_object obj,double *inp,double *xreg,int L,double *newxreg,double *xpred
                    ,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int s;
  int d;
  int N;
  int D;
  uint uVar5;
  double *pdVar6;
  uint ip;
  int id;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double *local_d8;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  s = obj->s;
  lVar16 = (long)s;
  ip = s * uVar3 + uVar1;
  uVar7 = uVar4 * s + uVar2 + 1;
  if ((int)uVar7 < (int)ip) {
    uVar7 = ip;
  }
  d = obj->d;
  N = obj->N;
  lVar8 = (long)N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar15 = s * D;
  C_00 = (double *)malloc((long)iVar15 * 8 + 8);
  id = d + iVar15;
  oup = (double *)malloc((long)id * 8 + 8);
  W = (double *)malloc(lVar8 * 8);
  resid = (double *)malloc(lVar8 * 8);
  phi = (double *)malloc((long)(int)uVar7 << 3);
  theta = (double *)malloc((long)(int)uVar7 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  dVar17 = 0.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    dVar17 = obj->mean;
  }
  if (0 < d) {
    deld(d,C);
  }
  if (0 < D) {
    delds(D,s,C_00);
  }
  conv(C,d + 1,C_00,iVar15 + 1,oup);
  if (0 < id) {
    uVar9 = 1;
    do {
      oup[uVar9] = -oup[uVar9];
      uVar9 = uVar9 + 1;
    } while (d + iVar15 + 1 != uVar9);
  }
  if (0 < N) {
    uVar5 = obj->r;
    pdVar6 = obj->res;
    lVar10 = 0;
    local_d8 = xreg;
    do {
      dVar18 = inp[lVar10];
      if (D == 0 && d == 0) {
        dVar18 = dVar18 - dVar17;
      }
      W[lVar10] = dVar18;
      if (0 < (int)uVar5) {
        pdVar13 = obj->exog;
        dVar18 = W[lVar10];
        uVar9 = 0;
        pdVar12 = local_d8;
        do {
          dVar18 = dVar18 - pdVar13[uVar9] * *pdVar12;
          W[lVar10] = dVar18;
          uVar9 = uVar9 + 1;
          pdVar12 = pdVar12 + lVar8;
        } while (uVar5 != uVar9);
      }
      resid[lVar10] = pdVar6[lVar10];
      lVar10 = lVar10 + 1;
      local_d8 = local_d8 + 1;
    } while (lVar10 != lVar8);
  }
  if (0 < (int)uVar7) {
    memset(theta,0,(ulong)uVar7 << 3);
    memset(phi,0,(ulong)uVar7 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar6 = obj->phi;
    uVar9 = 0;
    do {
      phi[uVar9] = pdVar6[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  if (0 < (int)uVar2) {
    pdVar6 = obj->theta;
    uVar9 = 0;
    do {
      theta[uVar9] = -pdVar6[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  if (0 < (int)uVar3) {
    pdVar6 = obj->PHI;
    uVar9 = 0;
    pdVar13 = phi;
    do {
      pdVar13 = pdVar13 + lVar16;
      uVar11 = uVar9 + 1;
      phi[uVar11 * lVar16 + -1] = pdVar6[uVar9] + phi[uVar11 * lVar16 + -1];
      if (0 < (int)uVar1) {
        pdVar12 = obj->phi;
        uVar14 = 0;
        do {
          pdVar13[uVar14] = pdVar13[uVar14] - pdVar12[uVar14] * pdVar6[uVar9];
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
      uVar9 = uVar11;
    } while (uVar11 != uVar3);
  }
  if (0 < (int)uVar4) {
    pdVar6 = obj->THETA;
    uVar9 = 0;
    pdVar13 = theta;
    do {
      pdVar13 = pdVar13 + lVar16;
      uVar11 = uVar9 + 1;
      theta[uVar11 * lVar16 + -1] = theta[uVar11 * lVar16 + -1] - pdVar6[uVar9];
      if (0 < (int)uVar2) {
        pdVar12 = obj->theta;
        uVar14 = 0;
        do {
          pdVar13[uVar14] = pdVar12[uVar14] * pdVar6[uVar9] + pdVar13[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
      uVar9 = uVar11;
    } while (uVar11 != uVar4);
  }
  forkal(ip,uVar4 * s + uVar2,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar1 = obj->r;
    uVar9 = 0;
    do {
      xpred[uVar9] = xpred[uVar9] + dVar17;
      if (0 < (int)uVar1) {
        pdVar6 = obj->exog;
        dVar18 = xpred[uVar9];
        uVar11 = 0;
        pdVar13 = newxreg;
        do {
          dVar18 = dVar18 + pdVar6[uVar11] * *pdVar13;
          xpred[uVar9] = dVar18;
          uVar11 = uVar11 + 1;
          pdVar13 = pdVar13 + (uint)L;
        } while (uVar1 != uVar11);
      }
      uVar9 = uVar9 + 1;
      newxreg = newxreg + 1;
    } while (uVar9 != (uint)L);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->r > 0) {
			for(j = 0; j < obj->r;++j) {
				W[i] -= obj->exog[j] * xreg[j*N+i];
			}
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		for(j = 0; j < obj->r;++j) {
			xpred[i] += obj->exog[j] * newxreg[j*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}